

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  undefined8 uVar1;
  pointer pVVar2;
  pointer pMVar3;
  ulong uVar4;
  Vector<float,_3> *pVVar5;
  float *pfVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Vector<float,_3> *pVVar10;
  long lVar11;
  int col;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  Mat3 shrinkScaleMat;
  long local_d0;
  undefined8 local_7c;
  undefined8 uStack_74;
  Matrix<float,_3,_3> local_58;
  
  pVVar5 = (Vector<float,_3> *)&local_58;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  pfVar6 = makeSafeLods::shrinkScaleMatData;
  lVar9 = 0;
  do {
    lVar12 = 0;
    pVVar10 = pVVar5;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)pVVar10->m_data)->m_data[0].m_data[0] = pfVar6[lVar12];
      lVar12 = lVar12 + 1;
      pVVar10 = pVVar10 + 1;
    } while (lVar12 != 3);
    lVar9 = lVar9 + 1;
    pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
    pfVar6 = pfVar6 + 3;
  } while (lVar9 != 3);
  if (*(int *)&(this->super_ShaderProgram).field_0x154 < 1) {
    return;
  }
  fVar28 = 1.0 / (float)viewportSize->m_data[0];
  fVar25 = 1.0 / (float)viewportSize->m_data[1];
  local_d0 = 0;
  lVar9 = 0;
  do {
    while( true ) {
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(undefined8 *)
               (textureSizes->
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar9].m_data;
      fVar16 = (float)(int)uVar1;
      fVar18 = (float)(int)((ulong)uVar1 >> 0x20);
      auVar20._0_4_ = pVVar2[lVar9].m_data[0] * fVar16 * fVar28;
      auVar20._4_4_ = pVVar2[lVar9].m_data[2] * fVar18 * fVar28;
      auVar20._8_4_ = fVar28 * 0.0;
      auVar20._12_4_ = fVar28 * 0.0;
      auVar26._0_4_ = pVVar2[lVar9].m_data[1] * fVar16 * fVar25;
      auVar26._4_4_ = pVVar2[lVar9].m_data[3] * fVar18 * fVar25;
      auVar26._8_4_ = fVar25 * 0.0;
      auVar26._12_4_ = fVar25 * 0.0;
      uVar4 = CONCAT44(auVar20._4_4_,auVar20._0_4_);
      auVar17._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar17._8_4_ = -auVar20._8_4_;
      auVar17._12_4_ = -auVar20._12_4_;
      auVar17 = maxps(auVar17,auVar20);
      uVar4 = CONCAT44(auVar26._4_4_,auVar26._0_4_);
      auVar21._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar21._8_4_ = -auVar26._8_4_;
      auVar21._12_4_ = -auVar26._12_4_;
      auVar22 = maxps(auVar21,auVar26);
      uVar14 = -(uint)(auVar22._0_4_ <= auVar17._0_4_);
      uVar15 = -(uint)(auVar22._4_4_ <= auVar17._4_4_);
      fVar16 = logf((float)(~uVar15 & (uint)auVar22._4_4_ | (uint)auVar17._4_4_ & uVar15) +
                    (float)(~uVar14 & (uint)auVar22._0_4_ | (uint)auVar17._0_4_ & uVar14));
      fVar16 = fVar16 * 1.442695;
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(undefined8 *)
               (textureSizes->
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar9].m_data;
      fVar18 = (float)(int)uVar1;
      fVar19 = (float)(int)((ulong)uVar1 >> 0x20);
      auVar23._0_4_ = pVVar2[lVar9].m_data[0] * fVar18 * fVar28;
      auVar23._4_4_ = pVVar2[lVar9].m_data[2] * fVar19 * fVar28;
      auVar23._8_4_ = fVar28 * 0.0;
      auVar23._12_4_ = fVar28 * 0.0;
      auVar27._0_4_ = pVVar2[lVar9].m_data[1] * fVar18 * fVar25;
      auVar27._4_4_ = pVVar2[lVar9].m_data[3] * fVar19 * fVar25;
      auVar27._8_4_ = fVar25 * 0.0;
      auVar27._12_4_ = fVar25 * 0.0;
      uVar4 = CONCAT44(auVar23._4_4_,auVar23._0_4_);
      auVar22._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar22._8_4_ = -auVar23._8_4_;
      auVar22._12_4_ = -auVar23._12_4_;
      auVar17 = maxps(auVar22,auVar23);
      uVar4 = CONCAT44(auVar27._4_4_,auVar27._0_4_);
      auVar24._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar24._8_4_ = -auVar27._8_4_;
      auVar24._12_4_ = -auVar27._12_4_;
      auVar22 = maxps(auVar24,auVar27);
      uVar14 = -(uint)(auVar22._0_4_ <= auVar17._0_4_);
      uVar15 = -(uint)(auVar22._4_4_ <= auVar17._4_4_);
      fVar18 = (float)(~uVar14 & (uint)auVar22._0_4_ | (uint)auVar17._0_4_ & uVar14);
      fVar19 = (float)(~uVar15 & (uint)auVar22._4_4_ | (uint)auVar17._4_4_ & uVar15);
      uVar14 = -(uint)(fVar19 <= fVar18);
      fVar18 = logf((float)(~uVar14 & (uint)fVar19 | (uint)fVar18 & uVar14));
      iVar13 = 0;
      iVar8 = 0;
      if (0.5 <= fVar16 + 0.01) {
        fVar19 = ceilf(fVar16 + 0.01 + 0.5);
        iVar8 = (int)fVar19 + -1;
      }
      fVar18 = fVar18 * 1.442695;
      if (0.5 <= fVar18 + -0.01) {
        fVar19 = ceilf(fVar18 + -0.01 + 0.5);
        iVar13 = (int)fVar19 + -1;
      }
      fVar19 = -fVar16;
      if (-fVar16 <= fVar16) {
        fVar19 = fVar16;
      }
      if (0.1 <= fVar19) break;
LAB_00367145:
      pfVar6 = (float *)&local_7c;
      tcu::operator*((Matrix<float,_3,_3> *)pfVar6,&local_58,
                     (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9);
      pMVar3 = (this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)(pMVar3->m_data).m_data[0].m_data + local_d0;
      lVar7 = 0;
      do {
        lVar11 = 0;
        do {
          *(undefined4 *)(lVar12 + lVar11) = *(undefined4 *)((long)pfVar6 + lVar11);
          lVar11 = lVar11 + 0xc;
        } while (lVar11 != 0x24);
        lVar7 = lVar7 + 1;
        lVar12 = lVar12 + 4;
        pfVar6 = pfVar6 + 1;
      } while (lVar7 != 3);
      calculateLodDerivateParts((Functional *)&local_7c,pMVar3 + lVar9);
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar9;
      *(undefined8 *)pVVar2->m_data = local_7c;
      *(undefined8 *)(pVVar2->m_data + 2) = uStack_74;
    }
    if (0.0 < fVar16) {
      fVar19 = floorf(fVar16);
      fVar19 = (fVar16 - fVar19) + -0.5;
      fVar16 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar16 = fVar19;
      }
      if (fVar16 < 0.1) goto LAB_00367145;
    }
    fVar16 = -fVar18;
    if (-fVar18 <= fVar18) {
      fVar16 = fVar18;
    }
    if (fVar16 < 0.1) goto LAB_00367145;
    if (0.0 < fVar18) {
      fVar16 = floorf(fVar18);
      fVar18 = (fVar18 - fVar16) + -0.5;
      fVar16 = -fVar18;
      if (-fVar18 <= fVar18) {
        fVar16 = fVar18;
      }
      if (fVar16 < 0.1) goto LAB_00367145;
    }
    if (iVar8 != iVar13) goto LAB_00367145;
    lVar9 = lVar9 + 1;
    local_d0 = local_d0 + 0x24;
    if (*(int *)&(this->super_ShaderProgram).field_0x154 <= lVar9) {
      return;
    }
  } while( true );
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec2>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMatData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	Mat3 shrinkScaleMat(shrinkScaleMatData);

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = shrinkScaleMat * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}